

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int ON_StringCompareOrdinalWideChar
              (wchar_t *string1,int element_count1,wchar_t *string2,int element_count2,
              bool bOrdinalIgnoreCase)

{
  int iVar1;
  bool bOrdinalIgnoreCase_local;
  int element_count2_local;
  wchar_t *string2_local;
  int element_count1_local;
  wchar_t *string1_local;
  
  iVar1 = ON_StringCompareOrdinalUTF32
                    ((ON__UINT32 *)string1,element_count1,(ON__UINT32 *)string2,element_count2,
                     bOrdinalIgnoreCase);
  return iVar1;
}

Assistant:

int ON_StringCompareOrdinalWideChar(
  const wchar_t* string1,
  int element_count1,
  const wchar_t* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
#if (1 == ON_SIZEOF_WCHAR_T)
    return ON_StringCompareOrdinalUTF8((const char*)string1, element_count1, (const char*)string2, element_count2, bOrdinalIgnoreCase);
#elif (2 == ON_SIZEOF_WCHAR_T)
  return ON_StringCompareOrdinalUTF16((const ON__UINT16*)string1, element_count1, (const ON__UINT16*)string2, element_count2, bOrdinalIgnoreCase);
#elif (4 == ON_SIZEOF_WCHAR_T)
  return ON_StringCompareOrdinalUTF32((const ON__UINT32*)string1, element_count1, (const ON__UINT32*)string2, element_count2, bOrdinalIgnoreCase);
#else
#error ON_SIZEOF_WCHAR_T is not defined or has an unexpected value
#endif
}